

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O0

bool __thiscall
CCommandProcessorFragment_SDL::RunCommand
          (CCommandProcessorFragment_SDL *this,CCommand *pBaseCommand)

{
  int iVar1;
  int *in_RSI;
  CVSyncCommand *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = *in_RSI;
  if (iVar1 == 8) {
    Cmd_Swap((CCommandProcessorFragment_SDL *)CONCAT44(8,in_stack_ffffffffffffffe0),
             (CSwapCommand *)in_RDI);
  }
  else if (iVar1 == 9) {
    Cmd_VSync((CCommandProcessorFragment_SDL *)CONCAT44(9,in_stack_ffffffffffffffe0),in_RDI);
  }
  else if (iVar1 == 20000) {
    Cmd_Init((CCommandProcessorFragment_SDL *)CONCAT44(20000,in_stack_ffffffffffffffe0),
             (CInitCommand *)in_RDI);
  }
  else {
    if (iVar1 != 0x4e21) {
      return false;
    }
    Cmd_Shutdown((CCommandProcessorFragment_SDL *)CONCAT44(0x4e21,in_stack_ffffffffffffffe0),
                 (CShutdownCommand *)in_RDI);
  }
  return true;
}

Assistant:

bool CCommandProcessorFragment_SDL::RunCommand(const CCommandBuffer::CCommand *pBaseCommand)
{
	switch(pBaseCommand->m_Cmd)
	{
	case CCommandBuffer::CMD_SWAP: Cmd_Swap(static_cast<const CCommandBuffer::CSwapCommand *>(pBaseCommand)); break;
	case CCommandBuffer::CMD_VSYNC: Cmd_VSync(static_cast<const CCommandBuffer::CVSyncCommand *>(pBaseCommand)); break;
	case CMD_INIT: Cmd_Init(static_cast<const CInitCommand *>(pBaseCommand)); break;
	case CMD_SHUTDOWN: Cmd_Shutdown(static_cast<const CShutdownCommand *>(pBaseCommand)); break;
	default: return false;
	}

	return true;
}